

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::peer_list::new_connection
          (peer_list *this,peer_connection_interface *c,int session_time,torrent_state *state)

{
  short sVar1;
  _Map_pointer ppptVar2;
  _Map_pointer ppptVar3;
  _Elt_pointer pptVar4;
  ipv6_peer *piVar5;
  _func_int **pp_Var6;
  peer_connection_interface *ppVar7;
  undefined2 uVar8;
  undefined8 uVar9;
  bool bVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  undefined4 extraout_var;
  short *psVar15;
  size_t sVar16;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  torrent_peer *this_00;
  undefined4 extraout_var_04;
  ipv6_peer *piVar17;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 extraout_var_13;
  long lVar18;
  undefined4 extraout_var_14;
  char *pcVar19;
  address *addr_00;
  address *addr_01;
  ushort uVar20;
  _Elt_pointer pptVar21;
  char *pcVar22;
  undefined1 auVar23 [16];
  string_view sVar24;
  match_peer_endpoint __pred;
  string i2p_dest;
  address addr;
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  _Elt_pointer local_1b8;
  _Elt_pointer pptStack_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [24];
  _Map_pointer ppptStack_170;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Elt_pointer local_148;
  _Elt_pointer pptStack_140;
  _Elt_pointer local_138;
  _Map_pointer ppptStack_130;
  undefined1 local_128 [32];
  ipv6_peer *local_108;
  _Map_pointer ppptStack_100;
  int local_ec;
  uint local_e8;
  undefined4 local_e4;
  undefined1 local_e0 [16];
  ulong local_d0;
  _Elt_pointer local_c8;
  uchar auStack_c0 [8];
  ipv6_peer *local_b8;
  _Map_pointer ppptStack_b0;
  uchar local_a0 [8];
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_98;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_78;
  const_iterator local_50;
  undefined4 extraout_var_00;
  undefined4 extraout_var_05;
  undefined4 extraout_var_12;
  
  local_ec = session_time;
  iVar12 = (**c->_vptr_peer_connection_interface)(c);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  lVar18 = *(long *)CONCAT44(extraout_var,iVar12);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,lVar18,((long *)CONCAT44(extraout_var,iVar12))[1] + lVar18);
  if ((local_1a8._M_string_length == 0 & state->allow_multiple_connections_per_ip) == 1) {
    iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
    psVar15 = (short *)CONCAT44(extraout_var_00,iVar12);
    if (*psVar15 != 2) {
      local_188._8_8_ = *(undefined8 *)(psVar15 + 4);
      local_188._16_8_ = *(undefined8 *)(psVar15 + 8);
      ppptStack_170 = (_Map_pointer)(ulong)*(uint *)(psVar15 + 0xc);
      local_188._4_4_ = 0;
    }
    else {
      local_188._4_4_ = *(undefined4 *)(psVar15 + 2);
      local_188._8_8_ = (_Elt_pointer)0x0;
      local_188._16_8_ = (ipv6_peer *)0x0;
      ppptStack_170 = (_Map_pointer)0x0;
    }
    local_188._1_3_ = 0;
    local_188[0] = *psVar15 != 2;
    find_peers((pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
                *)local_168,this,(address *)local_188);
    local_78._M_cur = (_Elt_pointer)local_168._0_8_;
    local_78._M_first = (_Elt_pointer)local_168._8_8_;
    local_78._M_last = (_Elt_pointer)local_158._M_allocated_capacity;
    local_78._M_node = (_Map_pointer)local_158._8_8_;
    local_98._M_cur = local_148;
    local_98._M_first = pptStack_140;
    local_98._M_last = local_138;
    local_98._M_node = ppptStack_130;
    __pred.m_port = psVar15[1] << 8 | (ushort)psVar15[1] >> 8;
    __pred.m_addr = (address *)local_188;
    __pred._10_6_ = 0;
    ::std::
    find_if<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
              ((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                *)local_128,&local_78,&local_98,__pred);
    pptVar21 = (_Elt_pointer)local_128._0_8_;
    if ((_Elt_pointer)local_128._0_8_ != local_148) goto LAB_002813f8;
    local_1b8 = (_Elt_pointer)local_128._8_8_;
    pptStack_1b0 = (_Elt_pointer)local_128._16_8_;
LAB_002815db:
    if ((state->max_peerlist_size != 0) &&
       (ppptVar2 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
       state->max_peerlist_size <=
       (int)((int)((ulong)((long)(this->m_peers).
                                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 .
                                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                          (long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
             (int)((ulong)((long)(this->m_peers).
                                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 .
                                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
            ((((uint)((int)ppptVar2 -
                     *(int *)&(this->m_peers).
                              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              .
                              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (uint)(ppptVar2 == (_Map_pointer)0x0)) * 0x40))) {
      erase_peers(this,state,(erase_peer_flags_t)0x2);
      ppptVar2 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppptVar3 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      piVar17 = (ipv6_peer *)
                (this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pptVar21 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
      pptVar4 = (this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      piVar5 = (ipv6_peer *)
               (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      if (state->max_peerlist_size <=
          (int)((int)((ulong)((long)piVar5 - (long)pptVar4) >> 3) +
                (int)((ulong)((long)piVar17 - (long)pptVar21) >> 3) +
               ((((uint)((int)ppptVar2 - (int)ppptVar3) >> 3) - 1) +
               (uint)(ppptVar2 == (_Map_pointer)0x0)) * 0x40)) {
        local_168 = (undefined1  [16])errors::make_error_code(too_many_connections);
        (*c->_vptr_peer_connection_interface[4])(c,local_168,1,0);
LAB_00281ef1:
        bVar10 = false;
        goto LAB_00281ef3;
      }
      local_a0 = (uchar  [8])
                 (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_b8 = (ipv6_peer *)
                 (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last;
      local_108 = piVar17;
      local_c8 = pptVar21;
      iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
      psVar15 = (short *)CONCAT44(extraout_var_03,iVar12);
      if (*psVar15 != 2) {
        local_e0 = *(undefined1 (*) [16])(psVar15 + 4);
        local_d0 = (ulong)*(uint *)(psVar15 + 0xc);
        local_e4 = 0;
      }
      else {
        local_e4 = *(undefined4 *)(psVar15 + 2);
        local_e0 = (undefined1  [16])0x0;
        local_d0 = 0;
      }
      local_e8 = (uint)(*psVar15 != 2);
      local_168[8] = local_a0[0];
      local_168[9] = local_a0[1];
      local_168[10] = local_a0[2];
      local_168[0xb] = local_a0[3];
      local_168[0xc] = local_a0[4];
      local_168[0xd] = local_a0[5];
      local_168[0xe] = local_a0[6];
      local_168[0xf] = local_a0[7];
      local_168._0_8_ = pptVar4;
      local_188._0_8_ = local_108;
      local_188._8_8_ = local_c8;
      local_188._16_8_ = local_b8;
      ppptStack_170 = ppptVar2;
      local_158._M_allocated_capacity = (size_type)piVar5;
      local_158._8_8_ = ppptVar3;
      ::std::
      __lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::aux::peer_address_compare>>
                (local_128);
      local_1b8 = (_Elt_pointer)local_128._8_8_;
      pptStack_1b0 = (_Elt_pointer)local_128._16_8_;
    }
    if (local_1a8._M_string_length == 0) {
      iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
      sVar1 = *(short *)CONCAT44(extraout_var_04,iVar12);
      iVar12 = (**this->m_peer_allocator->_vptr_torrent_peer_allocator_interface)
                         (this->m_peer_allocator,(ulong)(sVar1 != 2));
      piVar17 = (ipv6_peer *)CONCAT44(extraout_var_05,iVar12);
      if (piVar17 == (ipv6_peer *)0x0) {
        bVar10 = false;
        goto LAB_00281ef3;
      }
      if (sVar1 == 2) {
        iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
        ipv4_peer::ipv4_peer
                  ((ipv4_peer *)piVar17,(endpoint *)CONCAT44(extraout_var_07,iVar12),false,
                   (peer_source_flags_t)0x0);
      }
      else {
        iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
        ipv6_peer::ipv6_peer
                  (piVar17,(endpoint *)CONCAT44(extraout_var_06,iVar12),false,
                   (peer_source_flags_t)0x0);
      }
      local_50._M_first = local_1b8;
      local_50._M_last = pptStack_1b0;
      local_188._0_8_ = piVar17;
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      insert((iterator *)local_168,
             (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              *)this,&local_50,(value_type *)local_188);
      if ((long)(((long)(this->m_peers).
                        super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        .
                        super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)(this->m_peers).
                        super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        .
                        super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                 ((long)(local_168._0_8_ - local_168._8_8_) >> 3) +
                ((((ulong)(local_158._8_8_ -
                          (long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)((_Map_pointer)local_158._8_8_ == (_Map_pointer)0x0)) * 0x40) <=
          (long)this->m_round_robin) {
        this->m_round_robin = this->m_round_robin + 1;
      }
      this_00 = *(torrent_peer **)local_168._0_8_;
      *(uint *)&this_00->field_0x1b = *(uint *)&this_00->field_0x1b & 0xff81ffff | 0x400000;
    }
    else {
      sVar24._M_str = local_1a8._M_dataplus._M_p;
      sVar24._M_len = local_1a8._M_string_length;
      this_00 = add_i2p_peer(this,sVar24,(peer_source_flags_t)0x20,(pex_flags_t)0x0,state);
LAB_002817d8:
      if (this_00->connection == (peer_connection_interface *)0x0) {
        uVar13 = *(uint *)&this_00->field_0x1b;
        goto LAB_00281a33;
      }
    }
  }
  else {
    if (local_1a8._M_string_length != 0) {
      local_168 = *(undefined1 (*) [16])
                   &(this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start;
      local_158._M_allocated_capacity =
           (size_type)
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_158._8_8_ =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_188._0_8_ =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_188._8_8_ =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_188._16_8_ =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_last;
      ppptStack_170 =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ::std::
      __lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::aux::peer_address_compare>>
                (local_128);
      pptVar21 = (_Elt_pointer)local_128._0_8_;
      local_1b8 = (_Elt_pointer)local_128._8_8_;
      pptStack_1b0 = (_Elt_pointer)local_128._16_8_;
      if (((_Elt_pointer)local_128._0_8_ !=
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur) &&
         (((*(torrent_peer **)local_128._0_8_)->field_0x1e & 2) != 0)) {
        sVar24 = torrent_peer::dest(*(torrent_peer **)local_128._0_8_);
        sVar16 = sVar24._M_len;
        if ((sVar16 == local_1a8._M_string_length) &&
           ((sVar16 == 0 ||
            (iVar12 = bcmp(sVar24._M_str,local_1a8._M_dataplus._M_p,sVar16), iVar12 == 0))))
        goto LAB_002813f8;
      }
      goto LAB_002815db;
    }
    local_c8 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    auStack_c0 = (uchar  [8])
                 (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_b8 = (ipv6_peer *)
               (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppptStack_b0 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
    piVar17 = (ipv6_peer *)
              (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pptVar21 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_108 = (ipv6_peer *)
                (this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last;
    ppptStack_100 =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
    psVar15 = (short *)CONCAT44(extraout_var_01,iVar12);
    if (*psVar15 != 2) {
      local_e0 = *(undefined1 (*) [16])(psVar15 + 4);
      local_d0 = (ulong)*(uint *)(psVar15 + 0xc);
      local_e4 = 0;
    }
    else {
      local_e4 = *(undefined4 *)(psVar15 + 2);
      local_e0 = (undefined1  [16])0x0;
      local_d0 = 0;
    }
    local_e8 = (uint)(*psVar15 != 2);
    local_168[8] = auStack_c0[0];
    local_168[9] = auStack_c0[1];
    local_168[10] = auStack_c0[2];
    local_168[0xb] = auStack_c0[3];
    local_168[0xc] = auStack_c0[4];
    local_168[0xd] = auStack_c0[5];
    local_168[0xe] = auStack_c0[6];
    local_168[0xf] = auStack_c0[7];
    local_168._0_8_ = local_c8;
    local_158._M_allocated_capacity = (size_type)local_b8;
    local_158._8_8_ = ppptStack_b0;
    local_188._16_8_ = local_108;
    ppptStack_170 = ppptStack_100;
    local_188._0_8_ = piVar17;
    local_188._8_8_ = pptVar21;
    ::std::
    __lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::aux::peer_address_compare>>
              (local_128);
    pptVar21 = (_Elt_pointer)local_128._0_8_;
    local_1b8 = (_Elt_pointer)local_128._8_8_;
    pptStack_1b0 = (_Elt_pointer)local_128._16_8_;
    if ((_Elt_pointer)local_128._0_8_ ==
        (this->m_peers).
        super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        .
        super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) goto LAB_002815db;
    torrent_peer::address(*(torrent_peer **)local_128._0_8_);
    iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
    psVar15 = (short *)CONCAT44(extraout_var_02,iVar12);
    if (*psVar15 != 2) {
      pptVar4 = *(_Elt_pointer *)(psVar15 + 4);
      piVar17 = *(ipv6_peer **)(psVar15 + 8);
      local_188._8_8_ = pptVar4;
      local_188._16_8_ = piVar17;
      if (local_168._0_4_ == 1) {
        local_188[8] = SUB81(pptVar4,0);
        local_188[9] = (undefined1)((ulong)pptVar4 >> 8);
        local_188[10] = (undefined1)((ulong)pptVar4 >> 0x10);
        local_188[0xb] = (undefined1)((ulong)pptVar4 >> 0x18);
        local_188[0xc] = (undefined1)((ulong)pptVar4 >> 0x20);
        local_188[0xd] = (undefined1)((ulong)pptVar4 >> 0x28);
        local_188[0xe] = (undefined1)((ulong)pptVar4 >> 0x30);
        local_188[0xf] = (undefined1)((ulong)pptVar4 >> 0x38);
        local_188[0x10] = SUB81(piVar17,0);
        local_188[0x11] = (undefined1)((ulong)piVar17 >> 8);
        local_188[0x12] = (undefined1)((ulong)piVar17 >> 0x10);
        local_188[0x13] = (undefined1)((ulong)piVar17 >> 0x18);
        local_188[0x14] = (undefined1)((ulong)piVar17 >> 0x20);
        local_188[0x15] = (undefined1)((ulong)piVar17 >> 0x28);
        local_188[0x16] = (undefined1)((ulong)piVar17 >> 0x30);
        local_188[0x17] = (undefined1)((ulong)piVar17 >> 0x38);
        auVar23[0] = -(local_188[8] == local_168[8]);
        auVar23[1] = -(local_188[9] == local_168[9]);
        auVar23[2] = -(local_188[10] == local_168[10]);
        auVar23[3] = -(local_188[0xb] == local_168[0xb]);
        auVar23[4] = -(local_188[0xc] == local_168[0xc]);
        auVar23[5] = -(local_188[0xd] == local_168[0xd]);
        auVar23[6] = -(local_188[0xe] == local_168[0xe]);
        auVar23[7] = -(local_188[0xf] == local_168[0xf]);
        auVar23[8] = -(local_188[0x10] == local_158._M_local_buf[0]);
        auVar23[9] = -(local_188[0x11] == local_158._M_local_buf[1]);
        auVar23[10] = -(local_188[0x12] == local_158._M_local_buf[2]);
        auVar23[0xb] = -(local_188[0x13] == local_158._M_local_buf[3]);
        auVar23[0xc] = -(local_188[0x14] == local_158._M_local_buf[4]);
        auVar23[0xd] = -(local_188[0x15] == local_158._M_local_buf[5]);
        auVar23[0xe] = -(local_188[0x16] == local_158._M_local_buf[6]);
        auVar23[0xf] = -(local_188[0x17] == local_158._M_local_buf[7]);
        if (((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar23[0xf] >> 7) << 0xf) == 0xffff) &&
           ((_Map_pointer)local_158._8_8_ == (_Map_pointer)(ulong)*(uint *)(psVar15 + 0xc)))
        goto LAB_002813f8;
      }
      goto LAB_002815db;
    }
    if ((local_168._0_4_ != 0) || (local_168._4_4_ != *(in_addr_t *)(psVar15 + 2)))
    goto LAB_002815db;
LAB_002813f8:
    this_00 = *pptVar21;
    if ((this_00->connection != (peer_connection_interface *)0x0) &&
       (iVar12 = (*c->_vptr_peer_connection_interface[0x11])(c,4), (char)iVar12 != '\0')) {
      if (local_1a8._M_string_length == 0) {
        iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
        psVar15 = (short *)CONCAT44(extraout_var_08,iVar12);
        if (*psVar15 != 2) {
          local_188._8_8_ = *(undefined8 *)(psVar15 + 4);
          local_188._16_8_ = *(undefined8 *)(psVar15 + 8);
          ppptStack_170 = (_Map_pointer)(ulong)*(uint *)(psVar15 + 0xc);
          local_188._4_4_ = 0;
        }
        else {
          local_188._4_4_ = *(undefined4 *)(psVar15 + 2);
          local_188._8_8_ = (_Elt_pointer)0x0;
          local_188._16_8_ = (ipv6_peer *)0x0;
          ppptStack_170 = (_Map_pointer)0x0;
        }
        local_188._1_3_ = 0;
        local_188[0] = *psVar15 != 2;
        print_address_abi_cxx11_((string *)local_168,(aux *)local_188,addr_00);
        uVar9 = local_168._0_8_;
        torrent_peer::address(this_00);
        print_address_abi_cxx11_((string *)local_128,(aux *)&local_e8,addr_01);
        (*c->_vptr_peer_connection_interface[0x12])
                  (c,4,"DUPLICATE PEER","this: \"%s\" that: \"%s\"",uVar9,local_128._0_8_);
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._0_8_ != &local_158) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_158._M_allocated_capacity + 1));
        }
      }
      else {
        (*c->_vptr_peer_connection_interface[0x12])
                  (c,4,"DUPLICATE PEER","destination: \"%s\"",local_1a8._M_dataplus._M_p);
      }
    }
    uVar13 = *(uint *)&this_00->field_0x1b;
    if ((uVar13 >> 0x1b & 1) != 0) {
      local_168 = (undefined1  [16])errors::make_error_code(peer_banned);
      (*c->_vptr_peer_connection_interface[4])(c,local_168,1,0);
      goto LAB_00281ef1;
    }
    if (this_00->connection != (peer_connection_interface *)0x0) {
      pp_Var6 = this_00->connection->_vptr_peer_connection_interface;
      if (local_1a8._M_string_length == 0) {
        iVar12 = (*pp_Var6[2])();
        (*c->_vptr_peer_connection_interface[3])(local_168,c);
        bVar10 = boost::asio::ip::operator==
                           ((basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_10,iVar12)
                            ,(basic_endpoint<boost::asio::ip::tcp> *)local_168);
        if (!bVar10) {
          (*this_00->connection->_vptr_peer_connection_interface[3])(local_188);
          iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
          bVar10 = boost::asio::ip::operator==
                             ((basic_endpoint<boost::asio::ip::tcp> *)local_188,
                              (basic_endpoint<boost::asio::ip::tcp> *)
                              CONCAT44(extraout_var_11,iVar12));
          if (!bVar10) goto LAB_00281b99;
        }
LAB_00281b3e:
        local_168 = (undefined1  [16])errors::make_error_code(self_connection);
        (*c->_vptr_peer_connection_interface[4])(c,local_168,1,1);
        ppVar7 = this_00->connection;
        local_168 = (undefined1  [16])errors::make_error_code(self_connection);
        (*ppVar7->_vptr_peer_connection_interface[4])(ppVar7,local_168,1,1);
        goto LAB_00281ef1;
      }
      iVar12 = (*pp_Var6[1])();
      sVar16 = ((undefined8 *)CONCAT44(extraout_var_09,iVar12))[1];
      if ((sVar16 == local_1a8._M_string_length) &&
         ((sVar16 == 0 ||
          (iVar12 = bcmp(*(void **)CONCAT44(extraout_var_09,iVar12),local_1a8._M_dataplus._M_p,
                         sVar16), iVar12 == 0)))) goto LAB_00281b3e;
LAB_00281b99:
      iVar12 = (*this_00->connection->_vptr_peer_connection_interface[10])();
      iVar14 = (*c->_vptr_peer_connection_interface[10])(c);
      if ((char)iVar12 == (char)iVar14) {
        local_168 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
        (*c->_vptr_peer_connection_interface[4])(c,local_168,1,0);
        goto LAB_00281ef1;
      }
      if (local_1a8._M_string_length == 0) {
        iVar12 = (*c->_vptr_peer_connection_interface[10])(c);
        if ((char)iVar12 == '\0') {
          (*c->_vptr_peer_connection_interface[3])(local_188,c);
          uVar8 = local_188._2_2_;
          iVar12 = (*this_00->connection->_vptr_peer_connection_interface[2])();
          uVar20 = uVar8 << 8 | (ushort)uVar8 >> 8;
          uVar11 = *(ushort *)(CONCAT44(extraout_var_14,iVar12) + 2);
          uVar11 = uVar11 << 8 | uVar11 >> 8;
          local_108 = (ipv6_peer *)CONCAT44(local_108._4_4_,(uint)uVar20);
          local_1b8 = (_Elt_pointer)(ulong)uVar11;
          if (uVar20 < uVar11) goto LAB_00281dd5;
LAB_00281c6d:
          bVar10 = true;
          if (uVar20 == uVar11) {
            lVar18 = random((aux *)0x1);
            bVar10 = (int)lVar18 == 0;
          }
        }
        else {
          (*this_00->connection->_vptr_peer_connection_interface[3])(local_168);
          uVar8 = local_168._2_2_;
          iVar12 = (*c->_vptr_peer_connection_interface[2])(c);
          uVar20 = uVar8 << 8 | (ushort)uVar8 >> 8;
          uVar11 = *(ushort *)(CONCAT44(extraout_var_13,iVar12) + 2);
          uVar11 = uVar11 << 8 | uVar11 >> 8;
          local_108 = (ipv6_peer *)CONCAT44(local_108._4_4_,(uint)uVar20);
          local_1b8 = (_Elt_pointer)(ulong)uVar11;
          if (uVar20 <= uVar11) goto LAB_00281c6d;
LAB_00281dd5:
          bVar10 = false;
        }
        iVar12 = (*this_00->connection->_vptr_peer_connection_interface[0xe])();
        iVar14 = (*c->_vptr_peer_connection_interface[0x11])(c,4);
        piVar17 = local_108;
        if ((char)iVar14 != '\0') {
          pcVar22 = "no";
          pcVar19 = "yes";
          if (bVar10 || (char)iVar12 != '\0') {
            pcVar19 = "no";
            pcVar22 = "yes";
          }
          (*c->_vptr_peer_connection_interface[0x12])
                    (c,4,"DUPLICATE_PEER_RESOLUTION","our: %d other: %d disconnecting: %s",
                     (ulong)local_108 & 0xffffffff,local_1b8,pcVar19);
          (*this_00->connection->_vptr_peer_connection_interface[0x12])
                    (this_00->connection,4,"DUPLICATE_PEER_RESOLUTION",
                     "our: %d other: %d disconnecting: %s",(ulong)piVar17 & 0xffffffff,local_1b8,
                     pcVar22);
        }
        if (!bVar10 && (char)iVar12 == '\0') {
          local_168 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
          (*c->_vptr_peer_connection_interface[4])(c,local_168,1,0);
          goto LAB_00281ef1;
        }
        this->m_locked_peer = this_00;
        ppVar7 = this_00->connection;
        local_168 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
        (*ppVar7->_vptr_peer_connection_interface[4])(ppVar7,local_168,1,0);
      }
      else {
        iVar12 = (**this_00->connection->_vptr_peer_connection_interface)();
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(extraout_var_12,iVar12);
        iVar12 = (*c->_vptr_peer_connection_interface[10])(c);
        if ((char)iVar12 == '\0') {
          bVar10 = false;
        }
        else {
          bVar10 = ::std::operator>(&local_1a8,__rhs);
        }
        iVar12 = (*c->_vptr_peer_connection_interface[0x11])(c,4);
        if ((char)iVar12 != '\0') {
          pcVar22 = "yes";
          pcVar19 = "no";
          if (bVar10 != false) {
            pcVar19 = "yes";
            pcVar22 = "no";
          }
          (*c->_vptr_peer_connection_interface[0x12])
                    (c,4,"DUPLICATE_PEER_RESOLUTION","our: %s other: %s disconnecting: %s",
                     local_1a8._M_dataplus._M_p,(__rhs->_M_dataplus)._M_p,pcVar19);
          (*this_00->connection->_vptr_peer_connection_interface[0x12])
                    (this_00->connection,4,"DUPLICATE_PEER_RESOLUTION",
                     "our: %s other: %s disconnecting: %s",(__rhs->_M_dataplus)._M_p,
                     local_1a8._M_dataplus._M_p,pcVar22);
        }
        if (bVar10 != false) {
          local_168 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
          (*c->_vptr_peer_connection_interface[4])(c,local_168,1,0);
          goto LAB_00281ef1;
        }
        this->m_locked_peer = this_00;
        ppVar7 = this_00->connection;
        local_168 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
        (*ppVar7->_vptr_peer_connection_interface[4])(ppVar7,local_168,1,0);
      }
      this->m_locked_peer = (torrent_peer *)0x0;
      goto LAB_002817d8;
    }
LAB_00281a33:
    if (((uVar13 & 0x88000020) == 0x20) &&
       (((-1 < (char)uVar13 || (-1 < *(int *)&this->field_0x60)) &&
        ((int)(uVar13 & 0x1f) < this->m_max_failcount)))) {
      iVar12 = 1;
      if (1 < this->m_num_connect_candidates) {
        iVar12 = this->m_num_connect_candidates;
      }
      this->m_num_connect_candidates = iVar12 + -1;
    }
  }
  (*c->_vptr_peer_connection_interface[9])(c,this_00);
  (*c->_vptr_peer_connection_interface[0xb])
            (c,(ulong)this_00->prev_amount_download << 10,(ulong)this_00->prev_amount_upload << 10);
  this_00->prev_amount_upload = 0;
  this_00->prev_amount_download = 0;
  this_00->connection = c;
  iVar12 = (*c->_vptr_peer_connection_interface[0xc])(c);
  bVar10 = true;
  if ((char)iVar12 == '\0') {
    this_00->last_connected = (uint16_t)local_ec;
  }
LAB_00281ef3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return bVar10;
}

Assistant:

bool peer_list::new_connection(peer_connection_interface& c, int session_time
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
//		TORRENT_ASSERT(!c.is_outgoing());

		INVARIANT_CHECK;

		iterator iter;
		torrent_peer* i = nullptr;

#if TORRENT_USE_I2P
		std::string const i2p_dest = c.destination();
#else
		std::string const i2p_dest;
#endif

		bool found = false;
		// this check doesn't support i2p peers
		if (state->allow_multiple_connections_per_ip && i2p_dest.empty())
		{
			auto const& remote = c.remote();
			auto const addr = remote.address();
			auto const range = find_peers(addr);
			iter = std::find_if(range.first, range.second, match_peer_endpoint(addr, remote.port()));

			if (iter != range.second)
			{
				TORRENT_ASSERT((*iter)->in_use);
				found = true;
			}
		}
		else
		{
#if TORRENT_USE_I2P
			if (!i2p_dest.empty())
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, i2p_dest, peer_address_compare()
					);

				if (iter != m_peers.end() && (*iter)->is_i2p_addr && (*iter)->dest() == i2p_dest)
				{
					TORRENT_ASSERT((*iter)->in_use);
					found = true;
				}
			}
			else
#endif
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, c.remote().address(), peer_address_compare()
					);

				if (iter != m_peers.end() && (*iter)->address() == c.remote().address())
				{
					TORRENT_ASSERT((*iter)->in_use);
					found = true;
				}
			}
		}

		// make sure the iterator we got is properly sorted relative
		// to the connection's address
//		TORRENT_ASSERT(m_peers.empty()
//			|| (iter == m_peers.end() && (*(iter-1))->address() < c.remote().address())
//			|| (iter != m_peers.end() && c.remote().address() < (*iter)->address())
//			|| (iter != m_peers.end() && iter != m_peers.begin() && (*(iter-1))->address() < c.remote().address()));

		if (found)
		{
			i = *iter;
			TORRENT_ASSERT(i->in_use);
			TORRENT_ASSERT(i->connection != &c);
			TORRENT_ASSERT(i->address() == c.remote().address());

#ifndef TORRENT_DISABLE_LOGGING
			if (i->connection != nullptr && c.should_log(peer_log_alert::info))
			{
#if TORRENT_USE_I2P
				if (!i2p_dest.empty())
				{
					c.peer_log(peer_log_alert::info, "DUPLICATE PEER", "destination: \"%s\""
						, i2p_dest.c_str());
				}
				else
#endif
				{
					c.peer_log(peer_log_alert::info, "DUPLICATE PEER", "this: \"%s\" that: \"%s\""
						, print_address(c.remote().address()).c_str()
						, print_address(i->address()).c_str());
				}
			}
#endif
			if (i->banned)
			{
				c.disconnect(errors::peer_banned, operation_t::bittorrent);
				return false;
			}

			if (i->connection != nullptr)
			{
				bool self_connection = false;
#if TORRENT_USE_I2P
				if (!i2p_dest.empty())
				{
					self_connection = i->connection->local_i2p_endpoint() == i2p_dest;
				}
				else
#endif
				{
					self_connection = i->connection->remote() == c.local_endpoint()
					|| i->connection->local_endpoint() == c.remote();
				}

				if (self_connection)
				{
					c.disconnect(errors::self_connection, operation_t::bittorrent, peer_connection_interface::failure);
					TORRENT_ASSERT(i->connection->peer_info_struct() == i);
					i->connection->disconnect(errors::self_connection, operation_t::bittorrent, peer_connection_interface::failure);
					TORRENT_ASSERT(i->connection == nullptr);
					return false;
				}

				TORRENT_ASSERT(i->connection != &c);
				// the new connection is a local (outgoing) connection
				// or the current one is already connected
				if (i->connection->is_outgoing() == c.is_outgoing())
				{
					// if the other end connected to us both times, just drop
					// the second one. Or if we made both connections.
					c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					return false;
				}
#if TORRENT_USE_I2P
				else if (!i2p_dest.empty())
				{
					// duplicate connection resolution for i2p connections is
					// simple. The smaller address takes priority for making the
					// outgoing connection

					std::string const& other_dest = i->connection->destination();

					// decide which peer connection to disconnect
					// if the ports are equal, pick on at random
					bool disconnect1 = c.is_outgoing() && i2p_dest > other_dest;

#ifndef TORRENT_DISABLE_LOGGING
					if (c.should_log(peer_log_alert::info))
					{
						c.peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %s other: %s disconnecting: %s"
							, i2p_dest.c_str(), other_dest.c_str(), disconnect1 ? "yes" : "no");
						i->connection->peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %s other: %s disconnecting: %s"
							, other_dest.c_str(), i2p_dest.c_str(), disconnect1 ? "no" : "yes");
					}
#endif

					if (disconnect1)
					{
						c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
						return false;
					}
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = i;
					i->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
				}
#endif
				else
				{
					// at this point, we need to disconnect either
					// i->connection or c. In order for both this client
					// and the client on the other end to decide to
					// disconnect the same one, we need a consistent rule to
					// select which one.

					bool const outgoing1 = c.is_outgoing();

					// for this, we compare our ports and whoever has the lower port
					// should be the one keeping its outgoing connection. Since
					// outgoing ports are selected at random by the OS, we need to
					// be careful to only look at the target end of a connection for
					// the endpoint.

					int const our_port = outgoing1 ? i->connection->local_endpoint().port() : c.local_endpoint().port();
					int const other_port = outgoing1 ? c.remote().port() : i->connection->remote().port();

					// decide which peer connection to disconnect
					// if the ports are equal, pick on at random
					bool disconnect1 = ((our_port < other_port) && !outgoing1)
						|| ((our_port > other_port) && outgoing1)
						|| ((our_port == other_port) && random(1));
					disconnect1 &= !i->connection->failed();

#ifndef TORRENT_DISABLE_LOGGING
					if (c.should_log(peer_log_alert::info))
					{
						c.peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %d other: %d disconnecting: %s"
							, our_port, other_port, disconnect1 ? "yes" : "no");
						i->connection->peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %d other: %d disconnecting: %s"
							, our_port, other_port, disconnect1 ? "no" : "yes");
					}
#endif

					if (disconnect1)
					{
						c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
						return false;
					}
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = i;
					i->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
				}
			}

			if (is_connect_candidate(*i))
				update_connect_candidates(-1);
		}